

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# synced_bcf_reader.c
# Opt level: O3

int bcf_sr_set_samples(bcf_srs_t *files,char *fname,int is_file)

{
  uint uVar1;
  bcf_hdr_t *pbVar2;
  bcf_sr_t *pbVar3;
  kh_str2int_t *pkVar4;
  khint_t kVar5;
  uint uVar6;
  uint uVar7;
  int iVar8;
  char **ppcVar9;
  char **ppcVar10;
  char *pcVar11;
  int *piVar12;
  byte bVar13;
  undefined7 uVar15;
  char *pcVar14;
  uint uVar16;
  kh_str2int_t *hash_2;
  long lVar17;
  ulong uVar18;
  bcf_srs_t *pbVar19;
  khint32_t *pkVar20;
  int iVar21;
  uint uVar22;
  int *piVar23;
  char ***pppcVar24;
  char cVar25;
  long lVar26;
  undefined8 uVar27;
  int nsmpl;
  kh_str2int_t *hash;
  int ret;
  int local_94;
  bcf_srs_t *local_90;
  kh_str2int_t *local_88;
  char **local_80;
  char ***local_78;
  int *local_70;
  undefined8 local_68;
  undefined8 local_60;
  int local_54;
  ulong local_50;
  khint32_t *local_48;
  char *local_40;
  long local_38;
  
  local_90 = files;
  if ((byte)*fname == 0x5e) {
    local_88 = (kh_str2int_t *)calloc(1,0x28);
    if (local_88 == (kh_str2int_t *)0x0) {
LAB_00115d58:
      local_80 = hts_readlist(fname,is_file,&local_94);
      if (local_80 == (char **)0x0) {
LAB_0011614e:
        fprintf(_stderr,"Could not read the file: \"%s\"\n",fname);
        return 0;
      }
      local_60 = CONCAT71((int7)((ulong)local_80 >> 8),1);
      local_68 = 0;
      local_88 = (kh_str2int_t *)0x0;
      files = local_90;
      goto LAB_00115dcd;
    }
    ppcVar9 = hts_readlist(fname,is_file,&local_94);
    pkVar4 = local_88;
    files = local_90;
    if (ppcVar9 == (char **)0x0) goto LAB_0011614e;
    local_80 = ppcVar9;
    if (0 < local_94) {
      lVar17 = 0;
      do {
        kVar5 = kh_put_str2int(pkVar4,ppcVar9[lVar17],&local_54);
        if (local_54 != 0) {
          pkVar4->vals[kVar5] = pkVar4->size - 1;
        }
        lVar17 = lVar17 + 1;
      } while (lVar17 < local_94);
      local_68 = 0;
      local_60 = 0;
      goto LAB_00115dcd;
    }
    local_90->samples = (char **)0x0;
    local_90->n_smpl = 0;
    piVar23 = &local_90->n_smpl;
    pppcVar24 = &local_90->samples;
    uVar27 = 0;
  }
  else {
    uVar6 = (byte)*fname - 0x2d;
    if (uVar6 == 0) {
      uVar6 = (uint)(byte)fname[1];
    }
    if (uVar6 != 0) goto LAB_00115d58;
    pbVar2 = files->readers->header;
    local_80 = pbVar2->samples;
    local_94 = pbVar2->n[2];
    uVar15 = (undefined7)((ulong)local_80 >> 8);
    local_68 = CONCAT71(uVar15,1);
    local_88 = (kh_str2int_t *)0x0;
    local_60 = CONCAT71(uVar15,1);
LAB_00115dcd:
    local_78 = &files->samples;
    files->samples = (char **)0x0;
    local_70 = &files->n_smpl;
    files->n_smpl = 0;
    if (0 < local_94) {
      lVar17 = 0;
      do {
        if ((char)local_60 == '\0') {
          uVar6 = local_88->n_buckets;
          if (uVar6 != 0) {
            pcVar11 = local_80[lVar17];
            uVar22 = (uint)*pcVar11;
            if (*pcVar11 == '\0') {
              uVar22 = 0;
            }
            else {
              cVar25 = pcVar11[1];
              if (cVar25 != '\0') {
                pcVar14 = pcVar11 + 2;
                do {
                  uVar22 = (int)cVar25 + uVar22 * 0x1f;
                  cVar25 = *pcVar14;
                  pcVar14 = pcVar14 + 1;
                } while (cVar25 != '\0');
              }
            }
            uVar22 = uVar22 & uVar6 - 1;
            pkVar20 = local_88->flags;
            iVar21 = 1;
            uVar16 = uVar22;
            local_50 = (ulong)uVar6;
            local_48 = pkVar20;
            local_40 = pcVar11;
            local_38 = lVar17;
            do {
              uVar1 = pkVar20[uVar16 >> 4];
              bVar13 = (char)uVar16 * '\x02' & 0x1e;
              uVar7 = uVar1 >> bVar13;
              if (((uVar7 & 2) != 0) ||
                 (((uVar7 & 1) == 0 &&
                  (iVar8 = strcmp(local_88->keys[uVar16],pcVar11), pcVar11 = local_40,
                  pkVar20 = local_48, lVar17 = local_38, iVar8 == 0)))) {
                uVar6 = (uint)local_50;
                if ((uVar1 >> bVar13 & 3) != 0) {
                  uVar16 = uVar6;
                }
                goto LAB_00115ee5;
              }
              uVar16 = uVar16 + iVar21 & uVar6 - 1;
              iVar21 = iVar21 + 1;
            } while (uVar16 != uVar22);
            goto LAB_00115eed;
          }
          uVar16 = 0;
          uVar6 = 0;
LAB_00115ee5:
          if (uVar16 == uVar6) goto LAB_00115eed;
        }
        else {
LAB_00115eed:
          pppcVar24 = local_78;
          ppcVar9 = local_80;
          pbVar19 = local_90;
          iVar21 = local_90->nreaders;
          if (iVar21 < 1) {
            uVar18 = 0;
          }
          else {
            lVar26 = 0x18;
            uVar18 = 0;
            do {
              iVar8 = bcf_hdr_id2int(*(bcf_hdr_t **)((long)&pbVar19->readers->file + lVar26),2,
                                     ppcVar9[lVar17]);
              iVar21 = pbVar19->nreaders;
              if (iVar8 < 0) break;
              uVar18 = uVar18 + 1;
              lVar26 = lVar26 + 0x60;
            } while ((long)uVar18 < (long)iVar21);
          }
          piVar23 = local_70;
          if ((int)uVar18 == iVar21) {
            ppcVar10 = (char **)realloc(*pppcVar24,(long)*local_70 * 8 + 8);
            *pppcVar24 = ppcVar10;
            pcVar11 = strdup(ppcVar9[lVar17]);
            iVar21 = *piVar23;
            *piVar23 = iVar21 + 1;
            ppcVar10[iVar21] = pcVar11;
          }
          else {
            fprintf(_stderr,"Warning: The sample \"%s\" was not found in %s, skipping\n",
                    ppcVar9[lVar17],pbVar19->readers[uVar18 & 0xffffffff].fname);
          }
        }
        lVar17 = lVar17 + 1;
      } while (lVar17 < local_94);
    }
    piVar23 = local_70;
    pppcVar24 = local_78;
    uVar27 = local_68;
    if ((char)local_60 != '\0') {
      pbVar19 = local_90;
      ppcVar9 = local_80;
      cVar25 = (char)local_68;
      goto joined_r0x00115fe9;
    }
  }
  pkVar4 = local_88;
  pbVar19 = local_90;
  free(local_88->keys);
  free(pkVar4->flags);
  free(pkVar4->vals);
  free(pkVar4);
  cVar25 = (char)uVar27;
  ppcVar9 = local_80;
joined_r0x00115fe9:
  local_80 = ppcVar9;
  if (cVar25 == '\0') {
    if (0 < local_94) {
      lVar17 = 0;
      do {
        free(ppcVar9[lVar17]);
        lVar17 = lVar17 + 1;
      } while (lVar17 < local_94);
    }
    free(ppcVar9);
  }
  iVar21 = pbVar19->nreaders;
  uVar18 = (ulong)(uint)pbVar19->n_smpl;
  if (pbVar19->n_smpl == 0) {
    iVar8 = 0;
    if (1 < iVar21) {
      bcf_sr_set_samples_cold_1();
      iVar8 = 0;
    }
  }
  else {
    iVar8 = 1;
    if (0 < iVar21) {
      lVar17 = 0;
      local_78 = pppcVar24;
      local_70 = piVar23;
      do {
        pbVar3 = pbVar19->readers;
        iVar8 = (int)uVar18;
        piVar12 = (int *)malloc((long)iVar8 * 4);
        piVar23 = local_70;
        pppcVar24 = local_78;
        pbVar3[lVar17].samples = piVar12;
        pbVar3[lVar17].n_smpl = iVar8;
        if (0 < iVar8) {
          lVar26 = 0;
          do {
            iVar21 = bcf_hdr_id2int(pbVar3[lVar17].header,2,(*pppcVar24)[lVar26]);
            pbVar3[lVar17].samples[lVar26] = iVar21;
            lVar26 = lVar26 + 1;
            uVar18 = (ulong)*piVar23;
          } while (lVar26 < (long)uVar18);
          iVar21 = local_90->nreaders;
        }
        lVar17 = lVar17 + 1;
        pbVar19 = local_90;
      } while (lVar17 < iVar21);
      iVar8 = 1;
    }
  }
  return iVar8;
}

Assistant:

int bcf_sr_set_samples(bcf_srs_t *files, const char *fname, int is_file)
{
    int i, j, nsmpl, free_smpl = 0;
    char **smpl = NULL;

    void *exclude = (fname[0]=='^') ? khash_str2int_init() : NULL;
    if ( exclude || strcmp("-",fname) ) // "-" stands for all samples
    {
        smpl = hts_readlist(fname, is_file, &nsmpl);
        if ( !smpl )
        {
            fprintf(stderr,"Could not read the file: \"%s\"\n", fname);
            return 0;
        }
        if ( exclude )
        {
            for (i=0; i<nsmpl; i++)
                khash_str2int_inc(exclude, smpl[i]);
        }
        free_smpl = 1;
    }
    if ( !smpl )
    {
        smpl  = files->readers[0].header->samples;   // intersection of all samples
        nsmpl = bcf_hdr_nsamples(files->readers[0].header);
    }

    files->samples = NULL;
    files->n_smpl  = 0;
    for (i=0; i<nsmpl; i++)
    {
        if ( exclude && khash_str2int_has_key(exclude,smpl[i])  ) continue;

        int n_isec = 0;
        for (j=0; j<files->nreaders; j++)
        {
            if ( bcf_hdr_id2int(files->readers[j].header, BCF_DT_SAMPLE, smpl[i])<0 ) break;
            n_isec++;
        }
        if ( n_isec!=files->nreaders )
        {
            fprintf(stderr,"Warning: The sample \"%s\" was not found in %s, skipping\n", smpl[i], files->readers[n_isec].fname);
            continue;
        }

        files->samples = (char**) realloc(files->samples, (files->n_smpl+1)*sizeof(const char*));
        files->samples[files->n_smpl++] = strdup(smpl[i]);
    }

    if ( exclude ) khash_str2int_destroy(exclude);
    if ( free_smpl )
    {
        for (i=0; i<nsmpl; i++) free(smpl[i]);
        free(smpl);
    }

    if ( !files->n_smpl )
    {
        if ( files->nreaders>1 )
            fprintf(stderr,"No samples in common.\n");
        return 0;
    }
    for (i=0; i<files->nreaders; i++)
    {
        bcf_sr_t *reader = &files->readers[i];
        reader->samples  = (int*) malloc(sizeof(int)*files->n_smpl);
        reader->n_smpl   = files->n_smpl;
        for (j=0; j<files->n_smpl; j++)
            reader->samples[j] = bcf_hdr_id2int(reader->header, BCF_DT_SAMPLE, files->samples[j]);
    }
    return 1;
}